

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O2

void __thiscall PatchSecretARG::alter_world(PatchSecretARG *this,World *w)

{
  uint16_t uVar1;
  pointer ppEVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Color CVar8;
  Color CVar9;
  Color CVar10;
  Color CVar11;
  Color CVar12;
  Color CVar13;
  Color CVar14;
  Color CVar15;
  Color CVar16;
  Color CVar17;
  Color CVar18;
  RandomizerWorld *pRVar19;
  Map *pMVar20;
  Entity *pEVar21;
  MapPalette *palette;
  MapPalette *pMVar22;
  MapPalette *palette_00;
  Map *pMVar23;
  MapConnection *pMVar24;
  Entity *pEVar25;
  pointer ppEVar26;
  Map *pMVar27;
  byte bVar28;
  long lVar29;
  byte bVar30;
  ulong uVar31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long lStack_3b0;
  allocator<char> local_399;
  RandomizerWorld *local_398;
  Map *local_390;
  allocator_type local_384;
  allocator<char> local_383;
  allocator<char> local_382;
  allocator<char> local_381;
  PatchSecretARG *local_380;
  string PREFIX_STRING;
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_358;
  undefined **local_340;
  uint16_t local_338;
  uint8_t local_336;
  undefined2 local_330;
  bool local_32e;
  vector<MapConnection,_std::allocator<MapConnection>_> *local_328;
  MapPalette *local_320;
  string SUFFIX_STRING;
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_2f8;
  undefined **local_2e0;
  uint16_t local_2d8;
  uint8_t local_2d6;
  undefined2 local_2d0;
  bool local_2ce;
  vector<Entity_*,_std::allocator<Entity_*>_> statues;
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> local_2a8;
  undefined **local_290;
  uint16_t local_288;
  uint8_t local_286;
  undefined2 local_280;
  bool local_27e;
  undefined1 local_270 [32];
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_250;
  undefined **local_238;
  uint16_t local_230;
  uint8_t local_22e;
  undefined2 local_228;
  bool local_226;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  Attributes local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  WORDS;
  _Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> _Stack_100;
  undefined **local_e8;
  uint16_t local_e0;
  uint8_t local_de;
  undefined2 local_d8;
  bool local_d6;
  Attributes local_d0;
  Attributes local_80;
  
  local_380 = this;
  pMVar20 = World::map(w,0x72);
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x109c;
  local_270[2] = '*';
  local_270[3] = false;
  local_270[4] = false;
  local_270[5] = false;
  local_270[6] = false;
  local_270[7] = '\x02';
  local_270[8] = '\x01';
  local_270._18_2_ = 0;
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&PREFIX_STRING,
             "Foxy: What you are about to\naccomplish is grand, but can\nyou feel there is more to it?\x1e\nThis island hides a bigger\nmystery, something that has\nyet to be solved...\x1e\nPerhaps you should take a\ncloser look at the\ncrypt of Mercator.\x03"
             ,(allocator<char> *)&SUFFIX_STRING);
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar21,&PREFIX_STRING);
  std::__cxx11::string::~string((string *)&PREFIX_STRING);
  palette = (MapPalette *)operator_new(0x34);
  pMVar22 = World::map_palette(w,'\x1f');
  (palette->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar22->super_array<Color,_13UL>)._M_elems[0xc];
  uVar3 = *(undefined8 *)(pMVar22->super_array<Color,_13UL>)._M_elems;
  uVar4 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 2);
  uVar5 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 4);
  uVar6 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 6);
  uVar7 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10) = uVar7;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4) = uVar5;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6) = uVar6;
  *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems = uVar3;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2) = uVar4;
  Color::Color((Color *)local_270,' ',' ',0xc0);
  CVar8._b = local_270[2];
  CVar8._r = local_270[0];
  CVar8._g = local_270[1];
  CVar8._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[0] = CVar8;
  Color::Color((Color *)local_270,'`','`',0xc0);
  CVar9._b = local_270[2];
  CVar9._r = local_270[0];
  CVar9._g = local_270[1];
  CVar9._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[1] = CVar9;
  Color::Color((Color *)local_270,0xa0,0xa0,0xc0);
  CVar10._b = local_270[2];
  CVar10._r = local_270[0];
  CVar10._g = local_270[1];
  CVar10._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[2] = CVar10;
  Color::Color((Color *)local_270,'@','\0','@');
  CVar11._b = local_270[2];
  CVar11._r = local_270[0];
  CVar11._g = local_270[1];
  CVar11._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[4] = CVar11;
  Color::Color((Color *)local_270,0x80,0x80,'\0');
  CVar12._b = local_270[2];
  CVar12._r = local_270[0];
  CVar12._g = local_270[1];
  CVar12._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[0xb] = CVar12;
  Color::Color((Color *)local_270,0xc0,0xe0,'\0');
  CVar13._b = local_270[2];
  CVar13._r = local_270[0];
  CVar13._g = local_270[1];
  CVar13._invalid = (bool)local_270[3];
  (palette->super_array<Color,_13UL>)._M_elems[0xc] = CVar13;
  World::add_map_palette(w,palette);
  palette_00 = (MapPalette *)operator_new(0x34);
  pMVar20 = World::map(w,0x131);
  pMVar22 = pMVar20->_palette;
  (palette_00->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar22->super_array<Color,_13UL>)._M_elems[0xc];
  uVar3 = *(undefined8 *)(pMVar22->super_array<Color,_13UL>)._M_elems;
  uVar4 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 2);
  uVar5 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 4);
  uVar6 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 6);
  uVar7 = *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar22->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 10) = uVar7;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 4) = uVar5;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 6) = uVar6;
  *(undefined8 *)(palette_00->super_array<Color,_13UL>)._M_elems = uVar3;
  *(undefined8 *)((palette_00->super_array<Color,_13UL>)._M_elems + 2) = uVar4;
  local_390 = (Map *)palette;
  Color::Color((Color *)local_270,' ',' ','`');
  CVar14._b = local_270[2];
  CVar14._r = local_270[0];
  CVar14._g = local_270[1];
  CVar14._invalid = (bool)local_270[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[1] = CVar14;
  Color::Color((Color *)local_270,' ','@',0x80);
  CVar15._b = local_270[2];
  CVar15._r = local_270[0];
  CVar15._g = local_270[1];
  CVar15._invalid = (bool)local_270[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[2] = CVar15;
  Color::Color((Color *)local_270,'@','`',0xa0);
  CVar16._b = local_270[2];
  CVar16._r = local_270[0];
  CVar16._g = local_270[1];
  CVar16._invalid = (bool)local_270[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[3] = CVar16;
  Color::Color((Color *)local_270,' ',' ','@');
  CVar17._b = local_270[2];
  CVar17._r = local_270[0];
  CVar17._g = local_270[1];
  CVar17._invalid = (bool)local_270[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[5] = CVar17;
  Color::Color((Color *)local_270,' ','`',0x80);
  CVar18._b = local_270[2];
  CVar18._r = local_270[0];
  CVar18._g = local_270[1];
  CVar18._invalid = (bool)local_270[3];
  (palette_00->super_array<Color,_13UL>)._M_elems[8] = CVar18;
  World::add_map_palette(w,palette_00);
  pMVar20 = World::map(w,0x290);
  Map::clear_entities(pMVar20);
  pMVar23 = World::map(w,0x7c);
  pMVar20->_layout = pMVar23->_layout;
  pMVar23 = World::map(w,0x7c);
  pMVar20->_blockset = pMVar23->_blockset;
  pMVar20->_palette = (MapPalette *)local_390;
  pMVar20->_background_music = '\n';
  pMVar24 = World::map_connection(w,0x287,pMVar20->_id);
  if (pMVar24->_map_id_1 == pMVar20->_id) {
    lVar29 = 3;
    lStack_3b0 = 2;
  }
  else {
    if (pMVar24->_map_id_2 != pMVar20->_id) goto LAB_0013e23f;
    lVar29 = 9;
    lStack_3b0 = 8;
  }
  *(undefined1 *)((long)&pMVar24->_map_id_1 + lStack_3b0) = 0x1b;
  *(undefined1 *)((long)&pMVar24->_map_id_1 + lVar29) = 0x17;
LAB_0013e23f:
  local_320 = palette_00;
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x13a5;
  local_270[2] = '\x19';
  local_270[3] = '\x02';
  local_270[4] = true;
  local_270[5] = true;
  local_270[6] = false;
  local_270[7] = '\x01';
  local_270[8] = '\x01';
  local_270._18_2_ = 0;
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  (pEVar21->_attrs).fightable = false;
  (pEVar21->_attrs).behavior_id = 0;
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_ALL_VALID_EQUIPMENTS);
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&PREFIX_STRING,
             "Nole: A LONG TIME AGO, A DRAGON\nNAMED GOLA CAST A SPELL ON ME.\x1e\nI KNOW YOU DEFEATED ME IN\nMANY OTHER WORLDS, AS MY CURSE\nIS TO SEE AND REMEMBER THEM ALL.\x1e\nONLY YOU CAN END THIS, BUT\nTO GO ANY FURTHER, YOU WILL NEED\nTHE RIGHT TOOLS FOR THE JOB.\x03"
             ,(allocator<char> *)&SUFFIX_STRING);
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)w,pEVar21,&PREFIX_STRING);
  local_398 = (RandomizerWorld *)w;
  std::__cxx11::string::~string((string *)&PREFIX_STRING);
  pEVar21 = (Entity *)operator_new(0x58);
  PREFIX_STRING._M_dataplus._M_p._0_1_ = 0x13;
  PREFIX_STRING._M_dataplus._M_p._1_1_ = 0xf;
  PREFIX_STRING._M_dataplus._M_p._2_1_ = 0x15;
  PREFIX_STRING._M_dataplus._M_p._3_1_ = 7;
  PREFIX_STRING._M_dataplus._M_p._4_2_ = 1;
  PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._7_1_ = 0;
  PREFIX_STRING._M_string_length._0_1_ = 2;
  PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  PREFIX_STRING._M_string_length._1_2_ = 0;
  PREFIX_STRING._M_string_length._3_1_ = 0;
  PREFIX_STRING._M_string_length._4_1_ = 0;
  PREFIX_STRING._M_string_length._5_1_ = 0;
  PREFIX_STRING._M_string_length._6_2_ = 0;
  PREFIX_STRING.field_2._M_local_buf[0] = '\0';
  PREFIX_STRING.field_2._8_8_ = 0;
  _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340 = &PTR_to_json_abi_cxx11__002468a8;
  local_338 = 0xff;
  local_336 = 0xff;
  local_330._0_1_ = false;
  local_330._1_1_ = false;
  local_32e = false;
  Entity::Entity(pEVar21,(Attributes *)&PREFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358);
  Map::add_entity(pMVar20,pEVar21);
  pEVar25 = (Entity *)operator_new(0x58);
  SUFFIX_STRING._M_dataplus._M_p._0_2_ = 0x1099;
  SUFFIX_STRING._M_dataplus._M_p._2_1_ = 0x15;
  SUFFIX_STRING._M_dataplus._M_p._3_4_ = 0x107;
  SUFFIX_STRING._M_dataplus._M_p._7_1_ = 0;
  SUFFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  SUFFIX_STRING._M_string_length._0_4_ = 1;
  SUFFIX_STRING._12_5_ = 0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e0 = &PTR_to_json_abi_cxx11__002468a8;
  local_2d8 = 0xff;
  local_2d6 = 0xff;
  local_2d0._0_1_ = false;
  local_2d0._1_1_ = false;
  local_2ce = false;
  SUFFIX_STRING.field_2._8_8_ = pEVar21;
  Entity::Entity(pEVar25,(Attributes *)&SUFFIX_STRING);
  Map::add_entity(pMVar20,pEVar25);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_2f8);
  pEVar25 = (Entity *)operator_new(0x58);
  local_170.type_id = '\x13';
  local_170.position.x = '\x13';
  local_170.position.y = '\x15';
  local_170.position.z = '\a';
  local_170.position.half_x = false;
  local_170.position.half_y = false;
  local_170.position.half_z = false;
  local_170.orientation = '\0';
  local_170.palette = '\x02';
  local_170.behavior_id = 0;
  local_170.speed = '\0';
  local_170.fightable = false;
  local_170.liftable = false;
  local_170.can_pass_through = false;
  local_170.appear_after_player_moved_away = false;
  local_170.gravity_immune = false;
  local_170.talkable = false;
  local_170.dialogue = '\0';
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_170.persistence_flag.byte = 0xff;
  local_170.persistence_flag.bit = 0xff;
  local_170.flag_unknown_2_3 = false;
  local_170.flag_unknown_2_4 = false;
  local_170.flag_unknown_3_5 = false;
  local_170.entity_to_use_tiles_from = pEVar21;
  Entity::Entity(pEVar25,&local_170);
  Map::add_entity(pMVar20,pEVar25);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_170.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar25 = (Entity *)operator_new(0x58);
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x107151513;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 2;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = 0;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_8_ = 0;
  _Stack_100._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_100._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_100._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8 = &PTR_to_json_abi_cxx11__002468a8;
  local_e0 = 0xff;
  local_de = 0xff;
  local_d8._0_1_ = false;
  local_d8._1_1_ = false;
  local_d6 = false;
  Entity::Entity(pEVar25,(Attributes *)&WORDS);
  Map::add_entity(pMVar20,pEVar25);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_100);
  pEVar25 = (Entity *)operator_new(0x58);
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x107151613;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 2;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_2_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290 = &PTR_to_json_abi_cxx11__002468a8;
  local_288 = 0xff;
  local_286 = 0xff;
  local_280._0_1_ = false;
  local_280._1_1_ = false;
  local_27e = false;
  Entity::Entity(pEVar25,(Attributes *)&statues);
  Map::add_entity(pMVar20,pEVar25);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&local_2a8);
  pEVar25 = (Entity *)operator_new(0x58);
  local_80.type_id = 0x99;
  local_80.position.x = '\x19';
  local_80.position.y = '\x15';
  local_80.position.z = '\a';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\0';
  local_80.palette = '\x01';
  local_80.behavior_id = 0;
  local_80.speed = '\0';
  local_80.fightable = false;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = false;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  local_80.entity_to_use_tiles_from = pEVar21;
  Entity::Entity(pEVar25,&local_80);
  Map::add_entity(pMVar20,pEVar25);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_80.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  pEVar21 = (Entity *)operator_new(0x58);
  local_d0.type_id = '\\';
  local_d0.position.x = '\x10';
  local_d0.position.y = '\x1c';
  local_d0.position.z = '\x01';
  local_d0.position.half_x = true;
  local_d0.position.half_y = true;
  local_d0.behavior_id = 0;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\0';
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar21,&local_d0);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_d0.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_ALL_VALID_EQUIPMENTS);
  Map::add_entity(pMVar20,pEVar21);
  pRVar19 = local_398;
  local_380->_room_1 = pMVar20;
  pMVar20 = World::map(&local_398->super_World,0x8b);
  (pMVar20->_visited_flag).byte = 0xc0;
  (pMVar20->_visited_flag).bit = '\0';
  pMVar23 = World::map(&pRVar19->super_World,0x74);
  pMVar20->_layout = pMVar23->_layout;
  pMVar23 = World::map(&pRVar19->super_World,0x74);
  pMVar20->_blockset = pMVar23->_blockset;
  pMVar20->_palette = (MapPalette *)local_390;
  pMVar20->_background_music = '\n';
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x10e4;
  local_270[2] = '\x19';
  local_270[3] = true;
  local_270[4] = true;
  local_270[5] = true;
  local_270[6] = false;
  local_270[7] = '\0';
  local_270[8] = '\x01';
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = true;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270._18_2_ = 0;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Map::add_entity(pMVar20,pEVar21);
  pEVar21 = (Entity *)operator_new(0x58);
  PREFIX_STRING._M_dataplus._M_p._0_1_ = 0xec;
  PREFIX_STRING._M_dataplus._M_p._1_1_ = 0x10;
  PREFIX_STRING._M_dataplus._M_p._2_1_ = 0x13;
  PREFIX_STRING._M_dataplus._M_p._3_1_ = 1;
  PREFIX_STRING._M_dataplus._M_p._4_2_ = 0x101;
  PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._7_1_ = 0;
  PREFIX_STRING._M_string_length._0_1_ = 1;
  PREFIX_STRING._M_string_length._1_2_ = 0;
  PREFIX_STRING._M_string_length._3_1_ = 1;
  PREFIX_STRING._M_string_length._4_1_ = 0;
  PREFIX_STRING._M_string_length._5_1_ = 0;
  PREFIX_STRING._M_string_length._6_2_ = 0;
  PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  PREFIX_STRING.field_2._M_local_buf[0] = '\0';
  PREFIX_STRING.field_2._8_8_ = 0;
  _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340 = &PTR_to_json_abi_cxx11__002468a8;
  local_338 = 0xff;
  local_336 = 0xff;
  local_330._0_1_ = false;
  local_330._1_1_ = false;
  local_32e = false;
  Entity::Entity(pEVar21,(Attributes *)&PREFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358);
  Map::add_entity(pMVar20,pEVar21);
  pRVar19 = local_398;
  local_380->_room_2 = pMVar20;
  local_380->_room_1->_fall_destination = pMVar20->_id;
  pMVar20 = World::map(&local_398->super_World,0x8c);
  (pMVar20->_visited_flag).byte = 0xc0;
  (pMVar20->_visited_flag).bit = '\0';
  pMVar23 = World::map(&pRVar19->super_World,0x82);
  pMVar20->_layout = pMVar23->_layout;
  pMVar23 = World::map(&pRVar19->super_World,0x82);
  pMVar20->_blockset = pMVar23->_blockset;
  pMVar20->_palette = (MapPalette *)local_390;
  pMVar20->_background_music = '\n';
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x255c;
  local_270[2] = '\x1f';
  local_270[3] = true;
  local_270[4] = true;
  local_270[5] = true;
  local_270._18_2_ = 0;
  local_270[6] = false;
  local_270[7] = '\0';
  local_270[8] = '\0';
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Map::add_entity(pMVar20,pEVar21);
  pEVar25 = (Entity *)operator_new(0x58);
  PREFIX_STRING._M_dataplus._M_p._0_1_ = 0x5c;
  PREFIX_STRING._M_dataplus._M_p._1_1_ = 0x25;
  PREFIX_STRING._M_dataplus._M_p._2_1_ = 0x17;
  PREFIX_STRING._M_dataplus._M_p._3_1_ = 1;
  PREFIX_STRING._M_dataplus._M_p._4_2_ = 0x101;
  PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._7_1_ = 0;
  PREFIX_STRING._M_string_length._0_1_ = 0;
  PREFIX_STRING._M_string_length._1_2_ = 0;
  PREFIX_STRING._M_string_length._3_1_ = 0;
  PREFIX_STRING._M_string_length._4_1_ = 0;
  PREFIX_STRING._M_string_length._5_1_ = 0;
  PREFIX_STRING._M_string_length._6_2_ = 0;
  PREFIX_STRING.field_2._M_local_buf[0] = '\0';
  _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_340 = &PTR_to_json_abi_cxx11__002468a8;
  local_338 = 0xff;
  local_336 = 0xff;
  local_330._0_1_ = false;
  local_330._1_1_ = false;
  local_32e = false;
  PREFIX_STRING.field_2._8_8_ = pEVar21;
  Entity::Entity(pEVar25,(Attributes *)&PREFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358);
  Map::add_entity(pMVar20,pEVar25);
  pEVar21 = (Entity *)operator_new(0x58);
  SUFFIX_STRING._M_dataplus._M_p._0_2_ = 0x2584;
  SUFFIX_STRING._M_dataplus._M_p._2_1_ = 0x1c;
  SUFFIX_STRING._M_dataplus._M_p._3_4_ = 2;
  SUFFIX_STRING._M_dataplus._M_p._7_1_ = 1;
  SUFFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  SUFFIX_STRING._M_string_length._0_4_ = 3;
  SUFFIX_STRING._12_5_ = 0;
  SUFFIX_STRING.field_2._8_8_ = 0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = &PTR_to_json_abi_cxx11__002468a8;
  local_2d8 = 0xff;
  local_2d6 = 0xff;
  local_2d0._0_1_ = false;
  local_2d0._1_1_ = false;
  local_2ce = false;
  Entity::Entity(pEVar21,(Attributes *)&SUFFIX_STRING);
  pRVar19 = local_398;
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_2f8);
  Entity::only_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_1);
  Map::add_entity(pMVar20,pEVar21);
  pEVar25 = (Entity *)operator_new(0x58);
  local_170.type_id = 0x84;
  local_170.position.x = ')';
  local_170.position.y = '\x17';
  local_170.position.z = '\x02';
  local_170.position.half_x = false;
  local_170.position.half_y = false;
  local_170.position.half_z = false;
  local_170.orientation = '\x02';
  local_170.palette = '\x03';
  local_170.behavior_id = 0;
  local_170.speed = '\0';
  local_170.fightable = false;
  local_170.liftable = false;
  local_170.can_pass_through = false;
  local_170.appear_after_player_moved_away = false;
  local_170.gravity_immune = false;
  local_170.talkable = false;
  local_170.dialogue = '\0';
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_170.persistence_flag.byte = 0xff;
  local_170.persistence_flag.bit = 0xff;
  local_170.flag_unknown_2_3 = false;
  local_170.flag_unknown_2_4 = false;
  local_170.flag_unknown_3_5 = false;
  local_170.entity_to_use_tiles_from = pEVar21;
  Entity::Entity(pEVar25,&local_170);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_170.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Entity::only_when_flag_is_set(pEVar25,&FLAG_FOUND_GNOME_2);
  Map::add_entity(pMVar20,pEVar25);
  pEVar21 = (Entity *)operator_new(0x58);
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2232684;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 3;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = 0;
  WORDS.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._9_8_ = 0;
  _Stack_100._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_100._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_100._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = &PTR_to_json_abi_cxx11__002468a8;
  local_e0 = 0xff;
  local_de = 0xff;
  local_d8._0_1_ = false;
  local_d8._1_1_ = false;
  local_d6 = false;
  Entity::Entity(pEVar21,(Attributes *)&WORDS);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_100);
  Entity::only_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_3);
  Map::add_entity(pMVar20,pEVar21);
  pEVar21 = (Entity *)operator_new(0x58);
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x300000002202884;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 3;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_2_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_2a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290 = &PTR_to_json_abi_cxx11__002468a8;
  local_288 = 0xff;
  local_286 = 0xff;
  local_280._0_1_ = false;
  local_280._1_1_ = false;
  local_27e = false;
  Entity::Entity(pEVar21,(Attributes *)&statues);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&local_2a8);
  Entity::only_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_4);
  Map::add_entity(pMVar20,pEVar21);
  pEVar21 = (Entity *)operator_new(0x58);
  local_80.type_id = 0x9c;
  local_80.position.x = '%';
  local_80.position.y = '\x1a';
  local_80.position.z = '\x02';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\x01';
  local_80.palette = '\x01';
  local_80.behavior_id = 0;
  local_80.speed = '\0';
  local_80.fightable = false;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = false;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.entity_to_use_tiles_from = (Entity *)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  Entity::Entity(pEVar21,&local_80);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_80.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "Foxy: As you have heard\nfrom our mutual friend Nole,\x1e\nhe needs someone strong enough\nto break Gola\'s curse\nonce and for all.\x1e\nFour gnomes happen to have left\nGreenmaze and are causing\na ruckus in Mercator.\x1e\nBring them all back,\nand you shall pass...\x03"
             ,&local_399);
  RandomizerWorld::add_custom_dialogue_raw(pRVar19,pEVar21,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  local_380->_room_3 = pMVar20;
  local_328 = &(pRVar19->super_World)._map_connections;
  local_270._0_2_ = local_380->_room_2->_id;
  local_270[2] = '\x12';
  local_270[3] = '\x0f';
  local_270[4] = false;
  local_270[6] = SUB21(pMVar20->_id,0);
  local_270[7] = (uint8_t)(pMVar20->_id >> 8);
  local_270[8] = '(';
  local_270[9] = '%';
  local_270[10] = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (local_328,(MapConnection *)local_270);
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x2184;
  local_270[2] = '&';
  local_270[3] = true;
  local_270[4] = false;
  local_270[5] = false;
  local_270[6] = false;
  local_270[7] = '\x03';
  local_270[8] = '\x03';
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = true;
  local_270[0x10] = '\x01';
  local_270._18_2_ = 0;
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_1);
  pMVar20 = World::map(&pRVar19->super_World,0x294);
  Map::add_entity(pMVar20,pEVar21);
  pMVar20 = World::map(&pRVar19->super_World,0x294);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&PREFIX_STRING,
             "Gnome: Ahah, you found me!\nI was thinking about opening\na shop in here...\x03",
             (allocator<char> *)&SUFFIX_STRING);
  add_gnome_text(pMVar20,&pRVar19->super_World,&FLAG_FOUND_GNOME_1,&PREFIX_STRING);
  std::__cxx11::string::~string((string *)&PREFIX_STRING);
  pEVar21 = (Entity *)operator_new(0x58);
  PREFIX_STRING._M_dataplus._M_p._0_1_ = 0x84;
  PREFIX_STRING._M_dataplus._M_p._1_1_ = 0x23;
  PREFIX_STRING._M_dataplus._M_p._2_1_ = 0x1b;
  PREFIX_STRING._M_dataplus._M_p._3_1_ = 1;
  PREFIX_STRING._M_dataplus._M_p._4_2_ = 0x101;
  PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._7_1_ = 2;
  PREFIX_STRING._M_string_length._0_1_ = 3;
  PREFIX_STRING._M_string_length._1_2_ = 0;
  PREFIX_STRING._M_string_length._3_1_ = 0;
  PREFIX_STRING._M_string_length._4_1_ = 0;
  PREFIX_STRING._M_string_length._5_1_ = 0;
  PREFIX_STRING._M_string_length._6_2_ = 0x100;
  PREFIX_STRING.field_2._M_local_buf[0] = '\x03';
  PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  PREFIX_STRING.field_2._8_8_ = 0;
  _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340 = &PTR_to_json_abi_cxx11__002468a8;
  local_338 = 0xff;
  local_336 = 0xff;
  local_330._0_1_ = false;
  local_330._1_1_ = false;
  local_32e = false;
  Entity::Entity(pEVar21,(Attributes *)&PREFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358);
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_2);
  pMVar20 = World::map(&pRVar19->super_World,0x51);
  Map::add_entity(pMVar20,pEVar21);
  pMVar20 = World::map(&pRVar19->super_World,0x51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SUFFIX_STRING,
             "Gnome: Ahah, you found me!\nThese smashing and spinning\nboulders are so much fun!\x03"
             ,(allocator<char> *)&local_170);
  add_gnome_text(pMVar20,&pRVar19->super_World,&FLAG_FOUND_GNOME_2,&SUFFIX_STRING);
  std::__cxx11::string::~string((string *)&SUFFIX_STRING);
  pEVar21 = (Entity *)operator_new(0x58);
  SUFFIX_STRING._M_dataplus._M_p._0_2_ = 0x1784;
  SUFFIX_STRING._M_dataplus._M_p._2_1_ = 0x13;
  SUFFIX_STRING._M_dataplus._M_p._3_4_ = 0;
  SUFFIX_STRING._M_dataplus._M_p._7_1_ = 3;
  SUFFIX_STRING._M_string_length._0_4_ = 3;
  SUFFIX_STRING._12_5_ = 0x401000000;
  SUFFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  SUFFIX_STRING.field_2._8_8_ = 0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = &PTR_to_json_abi_cxx11__002468a8;
  local_2d8 = 0xff;
  local_2d6 = 0xff;
  local_2d0._0_1_ = false;
  local_2d0._1_1_ = false;
  local_2ce = false;
  Entity::Entity(pEVar21,(Attributes *)&SUFFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_2f8);
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_3);
  pMVar20 = World::map(&pRVar19->super_World,0x45);
  Map::add_entity(pMVar20,pEVar21);
  pMVar20 = World::map(&pRVar19->super_World,0x44);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "Gnome: Ahah, you found me!\nI came here because of the smell,\nand stayed for the taste.\x03"
             ,(allocator<char> *)&WORDS);
  add_gnome_text(pMVar20,&pRVar19->super_World,&FLAG_FOUND_GNOME_3,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  pMVar20 = World::map(&pRVar19->super_World,0x20);
  ppEVar2 = (pMVar20->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar26 = (pMVar20->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppEVar26 != ppEVar2;
      ppEVar26 = ppEVar26 + 1) {
    if (((*ppEVar26)->_attrs).palette == '\x03') {
      ((*ppEVar26)->_attrs).palette = '\x01';
    }
  }
  pEVar21 = (Entity *)operator_new(0x58);
  local_170.type_id = 0x84;
  local_170.position.x = '\x1f';
  local_170.position.y = '.';
  local_170.position.z = '\f';
  local_170.position.half_x = false;
  local_170.position.half_y = false;
  local_170.position.half_z = false;
  local_170.orientation = '\x03';
  local_170.palette = '\x03';
  local_170.speed = '\0';
  local_170.fightable = false;
  local_170.liftable = false;
  local_170.can_pass_through = false;
  local_170.appear_after_player_moved_away = false;
  local_170.gravity_immune = false;
  local_170.talkable = true;
  local_170.dialogue = '\x01';
  local_170.behavior_id = 0;
  local_170.entity_to_use_tiles_from = (Entity *)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_170.persistence_flag.byte = 0xff;
  local_170.persistence_flag.bit = 0xff;
  local_170.flag_unknown_2_3 = false;
  local_170.flag_unknown_2_4 = false;
  local_170.flag_unknown_3_5 = false;
  Entity::Entity(pEVar21,&local_170);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_170.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  Entity::remove_when_flag_is_set(pEVar21,&FLAG_FOUND_GNOME_4);
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&WORDS,
             "Gnome: Ahah, you found me!\nThe view here sure is something.\nDid you find all my friends?\x03"
             ,(allocator<char> *)&statues);
  add_gnome_text(pMVar20,&pRVar19->super_World,&FLAG_FOUND_GNOME_4,(string *)&WORDS);
  pMVar20 = local_390;
  std::__cxx11::string::~string((string *)&WORDS);
  ByteArray::add_word(&gnome_text_map_ids_table,0xffff);
  pMVar23 = World::map(&pRVar19->super_World,0x8d);
  (pMVar23->_visited_flag).byte = 0xc0;
  (pMVar23->_visited_flag).bit = '\0';
  pMVar27 = World::map(&pRVar19->super_World,0x8a);
  pMVar23->_layout = pMVar27->_layout;
  pMVar27 = World::map(&pRVar19->super_World,0x8a);
  pMVar23->_blockset = pMVar27->_blockset;
  pMVar23->_palette = (MapPalette *)pMVar20;
  pMVar23->_background_music = '\n';
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x145c;
  local_270[2] = '\x1d';
  local_270[3] = false;
  local_270[4] = true;
  local_270[5] = true;
  local_270[6] = true;
  local_270._18_2_ = 0;
  local_270[7] = '\0';
  local_270[8] = '\0';
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Map::add_entity(pMVar23,pEVar21);
  pEVar21 = (Entity *)operator_new(0x58);
  PREFIX_STRING._M_dataplus._M_p._0_1_ = 0x7a;
  PREFIX_STRING._M_dataplus._M_p._1_1_ = 0x14;
  PREFIX_STRING._M_dataplus._M_p._2_1_ = 0x17;
  PREFIX_STRING._M_dataplus._M_p._3_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._4_2_ = 0;
  PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
  PREFIX_STRING._M_dataplus._M_p._7_1_ = 3;
  PREFIX_STRING._M_string_length._0_1_ = 1;
  PREFIX_STRING._M_string_length._1_2_ = 0;
  PREFIX_STRING._M_string_length._3_1_ = 0;
  PREFIX_STRING._M_string_length._4_1_ = 0;
  PREFIX_STRING._M_string_length._5_1_ = 0;
  PREFIX_STRING._M_string_length._6_2_ = 0x100;
  PREFIX_STRING.field_2._M_local_buf[0] = '\0';
  PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
  PREFIX_STRING.field_2._8_8_ = 0;
  _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340 = &PTR_to_json_abi_cxx11__002468a8;
  local_338 = 0xff;
  local_336 = 0xff;
  local_330._0_1_ = false;
  local_330._1_1_ = false;
  local_32e = false;
  Entity::Entity(pEVar21,(Attributes *)&PREFIX_STRING);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358);
  Map::add_entity(pMVar23,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SUFFIX_STRING,
             "Pockets: Hello Nigel! I heard\nthere was a secret temple being\nuncovered here, so I came.\x1e\nThere are ancient writings on this\npillar, but I\'m no archeologist...\x03"
             ,(allocator<char> *)&local_170);
  pMVar22 = local_320;
  pRVar19 = local_398;
  RandomizerWorld::add_custom_dialogue_raw(local_398,pEVar21,&SUFFIX_STRING);
  std::__cxx11::string::~string((string *)&SUFFIX_STRING);
  local_380->_room_4 = pMVar23;
  local_270._0_2_ = local_380->_room_3->_id;
  local_270[2] = '%';
  local_270[3] = 0x1a;
  local_270[4] = false;
  local_270[6] = SUB21(pMVar23->_id,0);
  local_270[7] = (uint8_t)(pMVar23->_id >> 8);
  local_270[8] = '\x1a';
  local_270[9] = '\x13';
  local_270[10] = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (local_328,(MapConnection *)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x8e);
  (pMVar20->_visited_flag).byte = 0xc0;
  (pMVar20->_visited_flag).bit = '\0';
  pMVar23 = World::map(&pRVar19->super_World,0x15b);
  pMVar20->_layout = pMVar23->_layout;
  pMVar23 = World::map(&pRVar19->super_World,0x15b);
  pMVar20->_blockset = pMVar23->_blockset;
  pMVar20->_palette = pMVar22;
  pMVar20->_background_music = '\n';
  local_390 = pMVar20;
  for (bVar28 = 2; bVar28 < 7; bVar28 = bVar28 + 2) {
    pEVar21 = (Entity *)operator_new(0x58);
    local_270._0_2_ = 0x1362;
    local_270[2] = '\x19';
    local_270._18_2_ = 0;
    local_270[4] = false;
    local_270[5] = false;
    local_270[6] = false;
    local_270[7] = '\0';
    local_270[8] = '\0';
    local_270[9] = '\0';
    local_270[10] = false;
    local_270[0xb] = false;
    local_270[0xc] = false;
    local_270[0xd] = false;
    local_270[0xe] = false;
    local_270[0xf] = false;
    local_270[0x10] = '\0';
    _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_270._24_8_ = (Entity *)0x0;
    _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238 = &PTR_to_json_abi_cxx11__002468a8;
    local_230 = 0xff;
    local_22e = 0xff;
    local_228._0_1_ = false;
    local_228._1_1_ = false;
    local_226 = false;
    local_270[3] = bVar28;
    Entity::Entity(pEVar21,(Attributes *)local_270);
    Map::add_entity(local_390,pEVar21);
    std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  }
  for (bVar28 = 0x13; pMVar20 = local_390, bVar28 < 0x20; bVar28 = bVar28 + 0xc) {
    for (bVar30 = 0x13; bVar30 < 0x20; bVar30 = bVar30 + 0xc) {
      pEVar21 = (Entity *)operator_new(0x58);
      PREFIX_STRING._M_dataplus._M_p._0_1_ = 0xd4;
      PREFIX_STRING._M_dataplus._M_p._3_1_ = 0x1f;
      PREFIX_STRING._M_dataplus._M_p._4_2_ = 0x101;
      PREFIX_STRING._M_dataplus._M_p._6_1_ = 0;
      PREFIX_STRING._M_dataplus._M_p._7_1_ = 0;
      PREFIX_STRING._M_string_length._0_1_ = 1;
      PREFIX_STRING._M_string_length._1_2_ = 0;
      PREFIX_STRING._M_string_length._3_1_ = 1;
      PREFIX_STRING.field_2._M_allocated_capacity._2_2_ = 0;
      PREFIX_STRING.field_2._M_local_buf[0] = '\0';
      PREFIX_STRING._M_string_length._4_1_ = 0;
      PREFIX_STRING._M_string_length._5_1_ = 0;
      PREFIX_STRING._M_string_length._6_2_ = 0;
      _Stack_358._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _Stack_358._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PREFIX_STRING.field_2._8_8_ = 0;
      _Stack_358._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_340 = &PTR_to_json_abi_cxx11__002468a8;
      local_338 = 0xff;
      local_336 = 0xff;
      local_330._0_1_ = false;
      local_330._1_1_ = false;
      local_32e = false;
      PREFIX_STRING._M_dataplus._M_p._1_1_ = bVar28;
      PREFIX_STRING._M_dataplus._M_p._2_1_ = bVar30;
      Entity::Entity(pEVar21,(Attributes *)&PREFIX_STRING);
      Map::add_entity(local_390,pEVar21);
      std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_358)
      ;
    }
  }
  SUFFIX_STRING._M_string_length._0_4_ = 0x3e;
  SUFFIX_STRING._M_dataplus._M_p._0_2_ = 0x6bc0;
  SUFFIX_STRING._M_dataplus._M_p._2_1_ = 0x24;
  SUFFIX_STRING._M_dataplus._M_p._3_4_ = 0;
  SUFFIX_STRING._M_dataplus._M_p._7_1_ = 0;
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&local_390->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&SUFFIX_STRING);
  local_380->_room_5 = pMVar20;
  local_270._0_2_ = local_380->_room_4->_id;
  uVar1 = pMVar20->_id;
  local_270[2] = '\x15';
  local_270[3] = '\x15';
  local_270[4] = true;
  local_270[6] = SUB21(uVar1,0);
  local_270[7] = (uint8_t)(uVar1 >> 8);
  local_270[8] = '\x19';
  local_270[9] = '\"';
  local_270[10] = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (local_328,(MapConnection *)local_270);
  pRVar19 = local_398;
  pMVar20 = World::map(&local_398->super_World,0x8f);
  pMVar23 = World::map(&pRVar19->super_World,0x13f);
  pMVar20->_layout = pMVar23->_layout;
  pMVar23 = World::map(&pRVar19->super_World,0x13f);
  pMVar20->_blockset = pMVar23->_blockset;
  (pMVar20->_visited_flag).bit = '\0';
  (pMVar20->_visited_flag).byte = 0x3e;
  pMVar20->_palette = local_320;
  pMVar20->_background_music = '\n';
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x13a5;
  local_270[2] = '\x19';
  local_270[3] = '\x05';
  local_270[4] = false;
  local_270[5] = false;
  local_270[6] = false;
  local_270[7] = '\x01';
  local_270[8] = '\x01';
  local_270._18_2_ = 0;
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = false;
  local_270[0x10] = '\0';
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  (pEVar21->_attrs).fightable = false;
  (pEVar21->_attrs).behavior_id = 0;
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&PREFIX_STRING,
             "Nole: AT LAST, YOU ARE READY\nFOR THE FINAL TRIAL. TO KNOW\nWHAT TO DO,\x1e\nYOU WILL HAVE TO TALK TO HER.\nSHE HAS THE ANSWER ON HOW TO\nREACH THE HEART OF GOLA.\x1e\nPREPARE WELL BEFORE GOING THERE,\nSINCE IT WILL BE HARDER\nTHAN ANYTHING YOU EVER FACED.\x03"
             ,(allocator<char> *)&SUFFIX_STRING);
  RandomizerWorld::add_custom_dialogue_raw(local_398,pEVar21,&PREFIX_STRING);
  std::__cxx11::string::~string((string *)&PREFIX_STRING);
  local_380->_room_6 = pMVar20;
  local_270._0_2_ = local_380->_room_5->_id;
  local_270[2] = '\x13';
  local_270[3] = '\x19';
  local_270[4] = true;
  local_270[6] = SUB21(pMVar20->_id,0);
  local_270[7] = (uint8_t)(pMVar20->_id >> 8);
  local_270[8] = '\"';
  local_270[9] = '\x19';
  local_270[10] = false;
  std::vector<MapConnection,_std::allocator<MapConnection>_>::emplace_back<MapConnection>
            (local_328,(MapConnection *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&PREFIX_STRING,
             "Goddess: I shall give you one,\nand only one word...\x1e\nThis word is \"",
             (allocator<char> *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SUFFIX_STRING,"\".\x03",(allocator<char> *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,"OPEN",(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_Stack_250,"YOUR",(allocator<char> *)&statues);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"EYES",(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"TOWARDS",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"MIRROR",&local_399);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"INSIDE",&local_381);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"MASSAN",&local_382);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"CAVE",&local_383);
  __l._M_len = 8;
  __l._M_array = (iterator)local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&WORDS,__l,&local_384);
  lVar29 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(local_270 + lVar29));
    pRVar19 = local_398;
    lVar29 = lVar29 + -0x20;
  } while (lVar29 != -0x20);
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_1_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_2_ = 0;
  statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  pMVar20 = World::map(&local_398->super_World,0x122);
  pEVar21 = Map::entity(pMVar20,'\0');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x1e6);
  pEVar21 = Map::entity(pMVar20,'\0');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x240);
  pEVar21 = Map::entity(pMVar20,'\x02');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0xdc);
  pEVar21 = Map::entity(pMVar20,'\0');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x75);
  pEVar21 = Map::entity(pMVar20,'\x03');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x94);
  pEVar21 = Map::entity(pMVar20,'\x01');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x16f);
  pEVar21 = Map::entity(pMVar20,'\n');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  pMVar20 = World::map(&pRVar19->super_World,0x20a);
  pEVar21 = Map::entity(pMVar20,'\0');
  local_270._0_2_ = SUB82(pEVar21,0);
  local_270[2] = (uint8_t)((ulong)pEVar21 >> 0x10);
  local_270[3] = (byte)((ulong)pEVar21 >> 0x18);
  local_270[4] = SUB81((ulong)pEVar21 >> 0x20,0);
  local_270[5] = SUB81((ulong)pEVar21 >> 0x28,0);
  local_270[6] = SUB81((ulong)pEVar21 >> 0x30,0);
  local_270[7] = (uint8_t)((ulong)pEVar21 >> 0x38);
  std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*>
            ((vector<Entity*,std::allocator<Entity*>> *)&statues,(Entity **)local_270);
  lVar29 = 0;
  for (uVar31 = 0; pRVar19 = local_398,
      uVar31 < (ulong)(CONCAT71(statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_1_) -
                       (long)statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3); uVar31 = uVar31 + 1) {
    pEVar21 = statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar31];
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170,
                   &PREFIX_STRING,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((WORDS.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar29)
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170,
                   &SUFFIX_STRING);
    RandomizerWorld::add_custom_dialogue_raw
              (local_398,pEVar21,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)&local_170);
    lVar29 = lVar29 + 0x20;
  }
  pMVar20 = World::map(&local_398->super_World,0x156);
  pEVar21 = (Entity *)operator_new(0x58);
  local_270._0_2_ = 0x1951;
  local_270[2] = '\x18';
  local_270[3] = '\x03';
  local_270[4] = true;
  local_270[5] = false;
  local_270[6] = false;
  local_270[7] = '\0';
  local_270[8] = '\x01';
  local_270[9] = '\0';
  local_270[10] = false;
  local_270[0xb] = false;
  local_270[0xc] = false;
  local_270[0xd] = false;
  local_270[0xe] = false;
  local_270[0xf] = true;
  local_270[0x10] =
       (undefined1)
       ((uint)(*(int *)&(pMVar20->_speaker_ids).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish -
              *(int *)&(pMVar20->_speaker_ids).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 1);
  local_270._18_2_ = 0;
  local_270._24_8_ = (Entity *)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_250._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238 = &PTR_to_json_abi_cxx11__002468a8;
  local_230 = 0xff;
  local_22e = 0xff;
  local_228._0_1_ = false;
  local_228._1_1_ = false;
  local_226 = false;
  Entity::Entity(pEVar21,(Attributes *)local_270);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base(&_Stack_250);
  Map::add_entity(pMVar20,pEVar21);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "If only I could get closer to hear\nwhat the goddess has to say...\x03",
             (allocator<char> *)&local_80);
  RandomizerWorld::add_custom_dialogue_raw(pRVar19,pEVar21,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::_Vector_base<Entity_*,_std::allocator<Entity_*>_>::~_Vector_base
            (&statues.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&WORDS);
  std::__cxx11::string::~string((string *)&SUFFIX_STRING);
  std::__cxx11::string::~string((string *)&PREFIX_STRING);
  return;
}

Assistant:

void PatchSecretARG::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    add_foxy_in_knt(world);

    MapPalette* blue_palace_palette = build_blue_palace_palette(world);
    MapPalette* blue_shrine_palette = build_blue_shrine_palette(world);

    _room_1 = add_room_1(world, blue_palace_palette);

    _room_2 = add_room_2(world, blue_palace_palette);
    _room_1->fall_destination(_room_2->id());

    _room_3 = add_room_3(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 18, 15, _room_3->id(), 40, 37));

    add_gnomes_in_mercator(world);

    _room_4 = add_room_4(world, blue_palace_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 37, 26, _room_4->id(), 26, 19));

    _room_5 = add_room_5(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_4->id(), 21, 21, _room_5->id(), 25, 34, 2));

    _room_6 = add_room_6(world, blue_shrine_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_6->id(), 34, 25, 4));

    add_statue_dialogues(world);
}